

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerPrologEpilog(Lowerer *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EntryInstr *entryInstr;
  JITTimeFunctionBody *this_00;
  LabelInstr *epilogueLabel_00;
  ExitInstr *exitInstr;
  LabelInstr *epilogueLabel;
  Instr *instr;
  Lowerer *this_local;
  
  pIVar1 = this->m_func->m_headInstr;
  bVar3 = IR::Instr::IsEntryInstr(pIVar1);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1557,"(instr->IsEntryInstr())","First instr isn\'t an EntryInstr...");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  entryInstr = IR::Instr::AsEntryInstr(pIVar1);
  LowererMD::LowerEntryInstr(&this->m_lowererMD,entryInstr);
  pIVar1 = this->m_func->m_exitInstr;
  bVar3 = IR::Instr::IsExitInstr(pIVar1);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x155c,"(instr->IsExitInstr())","Last instr isn\'t an ExitInstr...");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsCoroutine(this_00);
  if ((bVar3) && (bVar3 = Func::IsLoopBody(this->m_func), !bVar3)) {
    epilogueLabel_00 =
         LowerGeneratorHelper::GetEpilogueForReturnStatements(&this->m_lowerGeneratorHelper);
    LowerGeneratorHelper::InsertNullOutGeneratorFrameInEpilogue
              (&this->m_lowerGeneratorHelper,epilogueLabel_00);
  }
  exitInstr = IR::Instr::AsExitInstr(pIVar1);
  LowererMD::LowerExitInstr(&this->m_lowererMD,exitInstr);
  return;
}

Assistant:

void
Lowerer::LowerPrologEpilog()
{
    IR::Instr * instr;

    instr = m_func->m_headInstr;
    AssertMsg(instr->IsEntryInstr(), "First instr isn't an EntryInstr...");

    m_lowererMD.LowerEntryInstr(instr->AsEntryInstr());

    instr = m_func->m_exitInstr;
    AssertMsg(instr->IsExitInstr(), "Last instr isn't an ExitInstr...");

    if (m_func->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
    {
        IR::LabelInstr* epilogueLabel = this->m_lowerGeneratorHelper.GetEpilogueForReturnStatements();
        this->m_lowerGeneratorHelper.InsertNullOutGeneratorFrameInEpilogue(epilogueLabel);
    }

    m_lowererMD.LowerExitInstr(instr->AsExitInstr());
}